

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_dr_flac_close(ma_dr_flac *pFlac)

{
  _func_void_void_ptr_void_ptr *UNRECOVERED_JUMPTABLE;
  
  if (pFlac != (ma_dr_flac *)0x0) {
    if ((pFlac->bs).onRead == ma_dr_flac__on_read_stdio) {
      fclose((FILE *)(pFlac->bs).pUserData);
    }
    if ((pFlac->container == ma_dr_flac_container_ogg) &&
       (*pFlac->_oggbs == ma_dr_flac__on_read_stdio)) {
      fclose(*(FILE **)((long)pFlac->_oggbs + 0x10));
    }
    UNRECOVERED_JUMPTABLE = (pFlac->allocationCallbacks).onFree;
    if (UNRECOVERED_JUMPTABLE != (_func_void_void_ptr_void_ptr *)0x0) {
      (*UNRECOVERED_JUMPTABLE)(pFlac,(pFlac->allocationCallbacks).pUserData);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_dr_flac_close(ma_dr_flac* pFlac)
{
    if (pFlac == NULL) {
        return;
    }
#ifndef MA_DR_FLAC_NO_STDIO
    if (pFlac->bs.onRead == ma_dr_flac__on_read_stdio) {
        fclose((FILE*)pFlac->bs.pUserData);
    }
#ifndef MA_DR_FLAC_NO_OGG
    if (pFlac->container == ma_dr_flac_container_ogg) {
        ma_dr_flac_oggbs* oggbs = (ma_dr_flac_oggbs*)pFlac->_oggbs;
        MA_DR_FLAC_ASSERT(pFlac->bs.onRead == ma_dr_flac__on_read_ogg);
        if (oggbs->onRead == ma_dr_flac__on_read_stdio) {
            fclose((FILE*)oggbs->pUserData);
        }
    }
#endif
#endif
    ma_dr_flac__free_from_callbacks(pFlac, &pFlac->allocationCallbacks);
}